

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O2

void klondike_updateBoard(Board *board)

{
  GAMEID GVar1;
  Spot *pSVar2;
  byte bVar3;
  byte spotIndex;
  
  bVar3 = 0xd;
  GVar1 = (gConfig.game)->id;
  if (1 < GVar1 - 0x17) {
    if (GVar1 == DOUBLEKLONDIKETURN1) {
      bVar3 = 9;
    }
    else {
      bVar3 = (GVar1 == DOUBLEKLONDIKETURN3) * '\x02' + 7;
    }
  }
  for (spotIndex = 0; spotIndex < bVar3; spotIndex = spotIndex + 1) {
    pSVar2 = board_spotGet(board,TABLEAU,spotIndex);
    if ((pSVar2->cardsCount != 0) && (pSVar2->cards[pSVar2->cardsCount - 1]->faceUp == false)) {
      pSVar2->cards[pSVar2->cardsCount - 1]->faceUp = true;
    }
  }
  return;
}

Assistant:

void klondike_updateBoard(Board * board)
{
	unsigned char i;
	unsigned char tableauCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 13 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 9 : 7));
	Spot * tableau;

	for(i=0;i<tableauCount;i++)
	{
		tableau = board_spotGet(board, TABLEAU, i);

		if(tableau->cardsCount==0)
			continue;

		if(!tableau->cards[tableau->cardsCount-1]->faceUp)
			tableau->cards[tableau->cardsCount-1]->faceUp = true;
	}
}